

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_attach.cpp
# Opt level: O3

SourceResultType __thiscall
duckdb::PhysicalAttach::GetData
          (PhysicalAttach *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  string *path;
  ClientContext *pCVar1;
  pointer pcVar2;
  StorageOptions options_00;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  DBConfig *pDVar6;
  pointer pAVar7;
  pointer pAVar8;
  FileSystem *fs;
  DatabaseManager *this_00;
  Catalog *pCVar9;
  type pAVar10;
  BinderException *this_01;
  MissingExtensionException *this_02;
  unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true> *info;
  optional_ptr<duckdb::AttachedDatabase,_true> existing_db;
  StorageOptions storage_options;
  string extension;
  optional_ptr<duckdb::AttachedDatabase,_true> attached_db;
  AttachOptions options;
  optional_ptr<duckdb::AttachedDatabase,_true> local_218;
  ExecutionContext *local_210;
  undefined1 local_208 [40];
  string local_1e0;
  undefined1 local_1c0 [32];
  pointer local_1a0;
  DBConfig *local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [96];
  _Alloc_hider local_90;
  char local_80 [16];
  string local_70;
  string local_50;
  
  local_210 = context;
  pDVar6 = DBConfig::GetConfig(context->client);
  info = &this->info;
  AttachOptions::AttachOptions((AttachOptions *)local_f0,info,(pDVar6->options).access_mode);
  pAVar7 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator->
                     (info);
  local_198 = pDVar6;
  pAVar8 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator->
                     (info);
  path = &pAVar8->path;
  if (local_f0._16_8_ == 0) {
    DBPathAndType::ExtractExtensionPrefix(path,(string *)(local_f0 + 8));
  }
  if ((pAVar7->name)._M_string_length == 0) {
    fs = FileSystem::GetFileSystem(local_210->client);
    AttachedDatabase::ExtractDatabaseName((string *)local_208,path,fs);
    ::std::__cxx11::string::operator=((string *)&pAVar7->name,(string *)local_208);
    if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
      operator_delete((void *)local_208._0_8_);
    }
  }
  local_1a0 = pAVar8;
  this_00 = DatabaseManager::Get(local_210->client);
  pAVar8 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator->
                     (info);
  if (pAVar8->on_conflict == IGNORE_ON_CONFLICT) {
LAB_01584a12:
    local_218 = DatabaseManager::GetDatabase(this_00,local_210->client,&pAVar7->name);
    if (local_218.ptr != (AttachedDatabase *)0x0) {
      optional_ptr<duckdb::AttachedDatabase,_true>::CheckValid(&local_218);
      bVar4 = AttachedDatabase::IsReadOnly(local_218.ptr);
      if (bVar4 && local_f0[0] == READ_WRITE) {
LAB_01584ddf:
        optional_ptr<duckdb::AttachedDatabase,_true>::CheckValid(&local_218);
        bVar4 = AttachedDatabase::IsReadOnly(local_218.ptr);
        EnumUtil::ToString<duckdb::AccessMode>((string *)local_208,bVar4 ^ READ_WRITE);
        EnumUtil::ToString<duckdb::AccessMode>((string *)&local_1e0,local_f0[0]);
        this_01 = (BinderException *)__cxa_allocate_exception(0x10);
        local_1c0._0_8_ = local_1c0 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c0,
                   "Database \"%s\" is already attached in %s mode, cannot re-attach in %s mode","")
        ;
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        pcVar2 = (pAVar7->name)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,pcVar2,pcVar2 + (pAVar7->name)._M_string_length);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,local_208._0_8_,(pointer)(local_208._0_8_ + local_208._8_8_)
                  );
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_170,local_1e0._M_dataplus._M_p,
                   local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
        BinderException::
        BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (this_01,(string *)local_1c0,&local_110,&local_130,&local_170);
        __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      optional_ptr<duckdb::AttachedDatabase,_true>::CheckValid(&local_218);
      bVar4 = AttachedDatabase::IsReadOnly(local_218.ptr);
      if (!bVar4 && local_f0[0] == READ_ONLY) goto LAB_01584ddf;
      if (local_50._M_string_length != 0) {
        optional_ptr<duckdb::AttachedDatabase,_true>::CheckValid(&local_218);
        pCVar9 = AttachedDatabase::GetCatalog(local_218.ptr);
        Catalog::SetDefaultTable(pCVar9,&local_70,&local_50);
      }
      pAVar7 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::
               operator->(info);
      if (pAVar7->on_conflict != REPLACE_ON_CONFLICT) goto LAB_01584d63;
      pcVar2 = local_208 + 0x10;
      local_208._0_8_ = pcVar2;
      if (local_f0._16_8_ == 0) {
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"duckdb","");
      }
      else {
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_208,local_f0._8_8_,(pointer)(local_f0._8_8_ + local_f0._16_8_));
      }
      optional_ptr<duckdb::AttachedDatabase,_true>::CheckValid(&local_218);
      pCVar9 = AttachedDatabase::GetCatalog(local_218.ptr);
      (*pCVar9->_vptr_Catalog[0x16])(&local_1e0,pCVar9);
      if (local_1e0._M_string_length == (local_1a0->path)._M_string_length) {
        if (local_1e0._M_string_length != 0) {
          iVar5 = bcmp(local_1e0._M_dataplus._M_p,(path->_M_dataplus)._M_p,
                       local_1e0._M_string_length);
          if (iVar5 != 0) goto LAB_01584b61;
        }
        optional_ptr<duckdb::AttachedDatabase,_true>::CheckValid(&local_218);
        pCVar9 = AttachedDatabase::GetCatalog(local_218.ptr);
        (*pCVar9->_vptr_Catalog[6])(local_1c0,pCVar9);
        uVar3 = local_1c0._0_8_;
        if (local_1c0._8_8_ == local_208._8_8_) {
          if (local_1c0._8_8_ == 0) {
            bVar4 = true;
          }
          else {
            iVar5 = bcmp((void *)local_1c0._0_8_,(void *)local_208._0_8_,local_1c0._8_8_);
            bVar4 = iVar5 == 0;
          }
        }
        else {
          bVar4 = false;
        }
        if ((AttachedDatabase *)uVar3 != (AttachedDatabase *)(local_1c0 + 0x10)) {
          operator_delete((void *)uVar3);
        }
      }
      else {
LAB_01584b61:
        bVar4 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p);
      }
      if ((pointer)local_208._0_8_ != pcVar2) {
        operator_delete((void *)local_208._0_8_);
      }
      if (bVar4) goto LAB_01584d63;
    }
  }
  else {
    pAVar8 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::
             operator->(info);
    if (pAVar8->on_conflict == REPLACE_ON_CONFLICT) goto LAB_01584a12;
  }
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,anon_var_dwarf_4ed193b + 9)
  ;
  bVar4 = FileSystem::IsRemoteFile((string *)path,&local_1e0);
  if (bVar4) {
    bVar4 = ExtensionHelper::TryAutoLoadExtension(local_210->client,(string *)&local_1e0);
    if (!bVar4) {
      this_02 = (MissingExtensionException *)__cxa_allocate_exception(0x10);
      local_208._0_8_ = local_208 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_208,"Attaching path \'%s\' requires extension \'%s\' to be loaded",
                 "");
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      pcVar2 = (local_1a0->path)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_150,pcVar2,pcVar2 + (local_1a0->path)._M_string_length);
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,local_1e0._M_dataplus._M_p,
                 local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
      MissingExtensionException::
      MissingExtensionException<std::__cxx11::string,std::__cxx11::string>
                (this_02,(string *)local_208,&local_150,&local_190);
      __cxa_throw(this_02,&MissingExtensionException::typeinfo,::std::runtime_error::~runtime_error)
      ;
    }
    if (local_f0[0] == AUTOMATIC) {
      local_f0[0] = READ_ONLY;
    }
  }
  pCVar1 = local_210->client;
  pAVar10 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator*
                      (info);
  DatabaseManager::GetDatabaseType(this_00,pCVar1,pAVar10,local_198,(AttachOptions *)local_f0);
  pCVar1 = local_210->client;
  pAVar10 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator*
                      (info);
  local_1c0._0_8_ =
       DatabaseManager::AttachDatabase(this_00,pCVar1,pAVar10,(AttachOptions *)local_f0);
  pAVar7 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator->
                     (info);
  AttachInfo::GetStorageOptions((StorageOptions *)local_208,pAVar7);
  optional_ptr<duckdb::AttachedDatabase,_true>::CheckValid
            ((optional_ptr<duckdb::AttachedDatabase,_true> *)local_1c0);
  options_00.row_group_size.index = local_208._8_8_;
  options_00.block_alloc_size.index = local_208._0_8_;
  options_00.storage_version.index = local_208._16_8_;
  options_00.block_header_size.index = local_208._24_8_;
  options_00._32_8_ = local_208._32_8_;
  AttachedDatabase::Initialize((AttachedDatabase *)local_1c0._0_8_,local_210->client,options_00);
  if (local_50._M_string_length != 0) {
    optional_ptr<duckdb::AttachedDatabase,_true>::CheckValid
              ((optional_ptr<duckdb::AttachedDatabase,_true> *)local_1c0);
    pCVar9 = AttachedDatabase::GetCatalog((AttachedDatabase *)local_1c0._0_8_);
    Catalog::SetDefaultTable(pCVar9,&local_70,&local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
LAB_01584d63:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_90._M_p != local_80) {
    operator_delete(local_90._M_p);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_f0 + 0x28));
  if ((undefined1 *)local_f0._8_8_ != local_f0 + 0x18) {
    operator_delete((void *)local_f0._8_8_);
  }
  return FINISHED;
}

Assistant:

SourceResultType PhysicalAttach::GetData(ExecutionContext &context, DataChunk &chunk,
                                         OperatorSourceInput &input) const {
	// parse the options
	auto &config = DBConfig::GetConfig(context.client);
	AttachOptions options(info, config.options.access_mode);

	// get the name and path of the database
	auto &name = info->name;
	auto &path = info->path;
	if (options.db_type.empty()) {
		DBPathAndType::ExtractExtensionPrefix(path, options.db_type);
	}
	if (name.empty()) {
		auto &fs = FileSystem::GetFileSystem(context.client);
		name = AttachedDatabase::ExtractDatabaseName(path, fs);
	}

	// check ATTACH IF NOT EXISTS
	auto &db_manager = DatabaseManager::Get(context.client);
	if (info->on_conflict == OnCreateConflict::IGNORE_ON_CONFLICT ||
	    info->on_conflict == OnCreateConflict::REPLACE_ON_CONFLICT) {
		// constant-time lookup in the catalog for the db name
		auto existing_db = db_manager.GetDatabase(context.client, name);
		if (existing_db) {
			if ((existing_db->IsReadOnly() && options.access_mode == AccessMode::READ_WRITE) ||
			    (!existing_db->IsReadOnly() && options.access_mode == AccessMode::READ_ONLY)) {

				auto existing_mode = existing_db->IsReadOnly() ? AccessMode::READ_ONLY : AccessMode::READ_WRITE;
				auto existing_mode_str = EnumUtil::ToString(existing_mode);
				auto attached_mode = EnumUtil::ToString(options.access_mode);
				throw BinderException("Database \"%s\" is already attached in %s mode, cannot re-attach in %s mode",
				                      name, existing_mode_str, attached_mode);
			}
			if (!options.default_table.name.empty()) {
				existing_db->GetCatalog().SetDefaultTable(options.default_table.schema, options.default_table.name);
			}
			if (info->on_conflict == OnCreateConflict::REPLACE_ON_CONFLICT) {
				// same path, name and type, DB does not need replacing
				auto const db_type = options.db_type.empty() ? "duckdb" : options.db_type;
				if (existing_db->GetCatalog().GetDBPath() == path &&
				    existing_db->GetCatalog().GetCatalogType() == db_type) {
					return SourceResultType::FINISHED;
				}
			} else {
				return SourceResultType::FINISHED;
			}
		}
	}

	string extension = "";
	if (FileSystem::IsRemoteFile(path, extension)) {
		if (!ExtensionHelper::TryAutoLoadExtension(context.client, extension)) {
			throw MissingExtensionException("Attaching path '%s' requires extension '%s' to be loaded", path,
			                                extension);
		}
		if (options.access_mode == AccessMode::AUTOMATIC) {
			// Attaching of remote files gets bumped to READ_ONLY
			// This is due to the fact that on most (all?) remote files writes to DB are not available
			// and having this raised later is not super helpful
			options.access_mode = AccessMode::READ_ONLY;
		}
	}

	// Get the database type and attach the database.
	db_manager.GetDatabaseType(context.client, *info, config, options);
	auto attached_db = db_manager.AttachDatabase(context.client, *info, options);

	//! Initialize the database.
	const auto storage_options = info->GetStorageOptions();
	attached_db->Initialize(context.client, storage_options);
	if (!options.default_table.name.empty()) {
		attached_db->GetCatalog().SetDefaultTable(options.default_table.schema, options.default_table.name);
	}
	return SourceResultType::FINISHED;
}